

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall
Js::ByteCodeWriter::Reg3B1(ByteCodeWriter *this,OpCode op,RegSlot R0,RegSlot R1,RegSlot R2,uint8 B3)

{
  code *pcVar1;
  uint8 B3_00;
  OpCode op_00;
  bool bVar2;
  RegSlot R0_00;
  RegSlot R1_00;
  RegSlot R2_00;
  undefined4 *puVar3;
  undefined6 in_register_00000032;
  undefined7 in_register_00000089;
  RegSlot local_45;
  RegSlot local_41;
  RegSlot local_3d;
  undefined1 local_39;
  undefined4 local_38;
  RegSlot local_34;
  
  local_38 = (undefined4)CONCAT71(in_register_00000089,B3);
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0xe);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    local_34 = R1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x26e,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_0089c325;
    *puVar3 = 0;
    R1 = local_34;
  }
  if (R0 != 0xffffffff) {
    if (this->m_functionWrite == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      local_34 = R1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_0089c325;
      *puVar3 = 0;
      R1 = local_34;
    }
    R0_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R0);
    if (R1 != 0xffffffff) {
      if (this->m_functionWrite == (FunctionBody *)0x0) {
        AssertCount = AssertCount + 1;
        local_34 = R0_00;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (!bVar2) goto LAB_0089c325;
        *puVar3 = 0;
        R0_00 = local_34;
      }
      local_34 = (RegSlot)CONCAT62(in_register_00000032,op);
      R1_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R1);
      if (R2 != 0xffffffff) {
        if (this->m_functionWrite != (FunctionBody *)0x0) {
LAB_0089c23b:
          R2_00 = FunctionBody::MapRegSlot(this->m_functionWrite,R2);
          op_00 = (OpCode)local_34;
          B3_00 = (uint8)local_38;
          local_34 = local_34 & 0xffff;
          bVar2 = TryWriteReg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                            (this,op_00,R0_00,R1_00,R2_00,(uint8)local_38);
          if (!bVar2) {
            bVar2 = TryWriteReg3B1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                              (this,(OpCode)local_34,R0_00,R1_00,R2_00,B3_00);
            if (!bVar2) {
              local_39 = (undefined1)local_38;
              local_45 = R0_00;
              local_41 = R1_00;
              local_3d = R2_00;
              Data::EncodeT<(Js::LayoutSize)2>(&this->m_byteCodeData,(OpCode)local_34,this);
              Data::Write(&this->m_byteCodeData,&local_45,0xd);
            }
          }
          return;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
        if (bVar2) {
          *puVar3 = 0;
          goto LAB_0089c23b;
        }
        goto LAB_0089c325;
      }
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar3 = 0;
    Throw::InternalError();
  }
LAB_0089c325:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::Reg3B1(OpCode op, RegSlot R0, RegSlot R1, RegSlot R2, uint8 B3)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::Reg3B1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        R0 = ConsumeReg(R0);
        R1 = ConsumeReg(R1);
        R2 = ConsumeReg(R2);

        MULTISIZE_LAYOUT_WRITE(Reg3B1, op, R0, R1, R2, B3);
    }